

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selectLinkLayer.cpp
# Opt level: O0

EC_T_DWORD
CreateLinkParmsFromCmdLineEG20T
          (EC_T_CHAR **ptcWord,EC_T_CHAR **lpCmdLine,EC_T_CHAR *tcStorage,EC_T_BOOL *pbGetNextWord,
          EC_T_LINK_PARMS **ppLinkParms)

{
  int iVar1;
  EC_T_BOOL EVar2;
  EC_T_LINK_PARMS *local_40;
  EC_T_LINK_PARMS_EG20T *pLinkParmsAdapter;
  EC_T_DWORD dwRetVal;
  EC_T_LINK_PARMS **ppLinkParms_local;
  EC_T_BOOL *pbGetNextWord_local;
  EC_T_CHAR *tcStorage_local;
  EC_T_CHAR **lpCmdLine_local;
  EC_T_CHAR **ptcWord_local;
  
  local_40 = (EC_T_LINK_PARMS *)0x0;
  iVar1 = strcasecmp(*ptcWord,"-eg20t");
  if (iVar1 == 0) {
    local_40 = (EC_T_LINK_PARMS *)malloc(0x40);
    if (local_40 == (EC_T_LINK_PARMS *)0x0) {
      pLinkParmsAdapter._4_4_ = 0x9811000a;
    }
    else {
      memset(local_40,0,0x40);
      LinkParmsInit(local_40,0xba12cb01,0x40,"EG20T",1,EcLinkMode_POLLING,0);
      EVar2 = ParseDword(ptcWord,lpCmdLine,tcStorage,&local_40->dwInstance);
      if ((EVar2 == 0) ||
         (EVar2 = ParseLinkMode(ptcWord,lpCmdLine,tcStorage,&local_40->eLinkMode), EVar2 == 0)) {
        pLinkParmsAdapter._4_4_ = 0x9811000b;
      }
      else {
        *ppLinkParms = local_40;
        pLinkParmsAdapter._4_4_ = 0;
      }
    }
  }
  else {
    pLinkParmsAdapter._4_4_ = 0x9811000c;
  }
  if ((pLinkParmsAdapter._4_4_ != 0) && (local_40 != (EC_T_LINK_PARMS *)0x0)) {
    free(local_40);
  }
  return pLinkParmsAdapter._4_4_;
}

Assistant:

static EC_T_DWORD CreateLinkParmsFromCmdLineEG20T(EC_T_CHAR** ptcWord, EC_T_CHAR** lpCmdLine, EC_T_CHAR* tcStorage, EC_T_BOOL*  pbGetNextWord,
                                                  EC_T_LINK_PARMS** ppLinkParms)
{
EC_T_DWORD dwRetVal = EC_E_ERROR;
EC_T_LINK_PARMS_EG20T* pLinkParmsAdapter = EC_NULL;

    EC_UNREFPARM(pbGetNextWord);

    /* check for matching adapter */
    if (OsStricmp((*ptcWord), "-eg20t") != 0)
    {
        dwRetVal = EC_E_NOTFOUND;
        goto Exit;
    }
    /* alloc adapter specific link parms */
    pLinkParmsAdapter = (EC_T_LINK_PARMS_EG20T*)OsMalloc(sizeof(EC_T_LINK_PARMS_EG20T));
    if (EC_NULL == pLinkParmsAdapter)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }
    OsMemset(pLinkParmsAdapter, 0, sizeof(EC_T_LINK_PARMS_CCAT));
    LinkParmsInit(&pLinkParmsAdapter->linkParms, EC_LINK_PARMS_SIGNATURE_EG20T, sizeof(EC_T_LINK_PARMS_EG20T), EC_LINK_PARMS_IDENT_EG20T, 1, EcLinkMode_POLLING);

    /* parse mandatory parameters: instance, mode */
    if ( !ParseDword(ptcWord, lpCmdLine, tcStorage, &pLinkParmsAdapter->linkParms.dwInstance)
        || !ParseLinkMode(ptcWord, lpCmdLine, tcStorage, &pLinkParmsAdapter->linkParms.eLinkMode))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }
    /* no errors */
    *ppLinkParms = &pLinkParmsAdapter->linkParms;
    dwRetVal = EC_E_NOERROR;

Exit:
    if (EC_E_NOERROR != dwRetVal)
    {
        SafeOsFree(pLinkParmsAdapter);
    }
    return dwRetVal;
}